

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O3

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/cjson_add.c"
            );
  UnityDefaultTestRun(cjson_add_null_should_add_null,"cjson_add_null_should_add_null",0x1ad);
  UnityDefaultTestRun(cjson_add_null_should_fail_with_null_pointers,
                      "cjson_add_null_should_fail_with_null_pointers",0x1ae);
  UnityDefaultTestRun(cjson_add_null_should_fail_on_allocation_failure,
                      "cjson_add_null_should_fail_on_allocation_failure",0x1af);
  UnityDefaultTestRun(cjson_add_true_should_add_true,"cjson_add_true_should_add_true",0x1b1);
  UnityDefaultTestRun(cjson_add_true_should_fail_with_null_pointers,
                      "cjson_add_true_should_fail_with_null_pointers",0x1b2);
  UnityDefaultTestRun(cjson_add_true_should_fail_on_allocation_failure,
                      "cjson_add_true_should_fail_on_allocation_failure",0x1b3);
  UnityDefaultTestRun(cjson_create_int_array_should_fail_on_allocation_failure,
                      "cjson_create_int_array_should_fail_on_allocation_failure",0x1b5);
  UnityDefaultTestRun(cjson_create_float_array_should_fail_on_allocation_failure,
                      "cjson_create_float_array_should_fail_on_allocation_failure",0x1b6);
  UnityDefaultTestRun(cjson_create_double_array_should_fail_on_allocation_failure,
                      "cjson_create_double_array_should_fail_on_allocation_failure",0x1b7);
  UnityDefaultTestRun(cjson_create_string_array_should_fail_on_allocation_failure,
                      "cjson_create_string_array_should_fail_on_allocation_failure",0x1b8);
  UnityDefaultTestRun(cjson_add_false_should_add_false,"cjson_add_false_should_add_false",0x1ba);
  UnityDefaultTestRun(cjson_add_false_should_fail_with_null_pointers,
                      "cjson_add_false_should_fail_with_null_pointers",0x1bb);
  UnityDefaultTestRun(cjson_add_false_should_fail_on_allocation_failure,
                      "cjson_add_false_should_fail_on_allocation_failure",0x1bc);
  UnityDefaultTestRun(cjson_add_bool_should_add_bool,"cjson_add_bool_should_add_bool",0x1be);
  UnityDefaultTestRun(cjson_add_bool_should_fail_with_null_pointers,
                      "cjson_add_bool_should_fail_with_null_pointers",0x1bf);
  UnityDefaultTestRun(cjson_add_bool_should_fail_on_allocation_failure,
                      "cjson_add_bool_should_fail_on_allocation_failure",0x1c0);
  UnityDefaultTestRun(cjson_add_number_should_add_number,"cjson_add_number_should_add_number",0x1c2)
  ;
  UnityDefaultTestRun(cjson_add_number_should_fail_with_null_pointers,
                      "cjson_add_number_should_fail_with_null_pointers",0x1c3);
  UnityDefaultTestRun(cjson_add_number_should_fail_on_allocation_failure,
                      "cjson_add_number_should_fail_on_allocation_failure",0x1c4);
  UnityDefaultTestRun(cjson_add_string_should_add_string,"cjson_add_string_should_add_string",0x1c6)
  ;
  UnityDefaultTestRun(cjson_add_string_should_fail_with_null_pointers,
                      "cjson_add_string_should_fail_with_null_pointers",0x1c7);
  UnityDefaultTestRun(cjson_add_string_should_fail_on_allocation_failure,
                      "cjson_add_string_should_fail_on_allocation_failure",0x1c8);
  UnityDefaultTestRun(cjson_add_raw_should_add_raw,"cjson_add_raw_should_add_raw",0x1ca);
  UnityDefaultTestRun(cjson_add_raw_should_fail_with_null_pointers,
                      "cjson_add_raw_should_fail_with_null_pointers",0x1cb);
  UnityDefaultTestRun(cjson_add_raw_should_fail_on_allocation_failure,
                      "cjson_add_raw_should_fail_on_allocation_failure",0x1cc);
  UnityDefaultTestRun(cJSON_add_object_should_add_object,"cJSON_add_object_should_add_object",0x1ce)
  ;
  UnityDefaultTestRun(cjson_add_object_should_fail_with_null_pointers,
                      "cjson_add_object_should_fail_with_null_pointers",0x1cf);
  UnityDefaultTestRun(cjson_add_object_should_fail_on_allocation_failure,
                      "cjson_add_object_should_fail_on_allocation_failure",0x1d0);
  UnityDefaultTestRun(cJSON_add_array_should_add_array,"cJSON_add_array_should_add_array",0x1d2);
  UnityDefaultTestRun(cjson_add_array_should_fail_with_null_pointers,
                      "cjson_add_array_should_fail_with_null_pointers",0x1d3);
  UnityDefaultTestRun(cjson_add_array_should_fail_on_allocation_failure,
                      "cjson_add_array_should_fail_on_allocation_failure",0x1d4);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    UNITY_BEGIN();

    RUN_TEST(cjson_add_null_should_add_null);
    RUN_TEST(cjson_add_null_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_null_should_fail_on_allocation_failure);

    RUN_TEST(cjson_add_true_should_add_true);
    RUN_TEST(cjson_add_true_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_true_should_fail_on_allocation_failure);

    RUN_TEST(cjson_create_int_array_should_fail_on_allocation_failure);
    RUN_TEST(cjson_create_float_array_should_fail_on_allocation_failure);
    RUN_TEST(cjson_create_double_array_should_fail_on_allocation_failure);
    RUN_TEST(cjson_create_string_array_should_fail_on_allocation_failure);

    RUN_TEST(cjson_add_false_should_add_false);
    RUN_TEST(cjson_add_false_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_false_should_fail_on_allocation_failure);

    RUN_TEST(cjson_add_bool_should_add_bool);
    RUN_TEST(cjson_add_bool_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_bool_should_fail_on_allocation_failure);

    RUN_TEST(cjson_add_number_should_add_number);
    RUN_TEST(cjson_add_number_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_number_should_fail_on_allocation_failure);

    RUN_TEST(cjson_add_string_should_add_string);
    RUN_TEST(cjson_add_string_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_string_should_fail_on_allocation_failure);

    RUN_TEST(cjson_add_raw_should_add_raw);
    RUN_TEST(cjson_add_raw_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_raw_should_fail_on_allocation_failure);

    RUN_TEST(cJSON_add_object_should_add_object);
    RUN_TEST(cjson_add_object_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_object_should_fail_on_allocation_failure);

    RUN_TEST(cJSON_add_array_should_add_array);
    RUN_TEST(cjson_add_array_should_fail_with_null_pointers);
    RUN_TEST(cjson_add_array_should_fail_on_allocation_failure);

    return UNITY_END();
}